

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O1

void __thiscall
ConfidentialValue_Constractor_Test::~ConfidentialValue_Constractor_Test
          (ConfidentialValue_Constractor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor) {
  ConfidentialValue value;

  EXPECT_STREQ(value.GetHex().c_str(), "");
  EXPECT_EQ(value.GetData().GetDataSize(), 0);
  EXPECT_EQ(value.HasBlinding(), false);
  int64_t satoshi = 0;
  EXPECT_NO_THROW((satoshi = value.GetAmount().GetSatoshiValue()));
  EXPECT_EQ(satoshi, 0);
}